

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

string * __thiscall
iutest::detail::ElementsAreArrayMatcher<int>::WhichIs
          (string *__return_storage_ptr__,ElementsAreArrayMatcher<int> *this,string *msg)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  iu_global_format_stringstream strm;
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  pcVar2 = "ElementsAreArrayForward: ";
  bVar3 = this->m_expected_elem_count != false;
  if (bVar3) {
    pcVar2 = "ElementsAreArray: ";
  }
  lVar1 = 0x19;
  if (bVar3) {
    lVar1 = 0x12;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1a0 + 0x10),pcVar2,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a0 + 0x10),(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

::std::string WhichIs(const ::std::string& msg) const
    {
        iu_global_format_stringstream strm;
        if( m_expected_elem_count )
        {
            strm << "ElementsAreArray: ";
        }
        else
        {
            strm << "ElementsAreArrayForward: ";
        }
        strm << msg;
        return strm.str();
    }